

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::widgets::checkbox::~checkbox(checkbox *this)

{
  base_widget *in_RDI;
  checkbox *unaff_retaddr;
  
  ~checkbox(unaff_retaddr,(void **)in_RDI);
  base_widget::~base_widget(in_RDI);
  return;
}

Assistant:

checkbox::~checkbox()
{
}